

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::ReadListFile(cmMakefile *this,char *filename)

{
  pointer *pppcVar1;
  bool bVar2;
  bool bVar3;
  char *in_base;
  cmListFile listFile;
  ListFileScope scope;
  string filenametoread;
  cmParseFileScope pfs;
  string local_98;
  ListFileScope local_70;
  string local_60;
  cmParseFileScope local_40;
  
  std::__cxx11::string::string((string *)&local_98,filename,(allocator *)&local_70);
  cmState::Snapshot::GetDirectory((Directory *)&local_40,&this->StateSnapshot);
  in_base = cmState::Directory::GetCurrentSource((Directory *)&local_40);
  cmsys::SystemTools::CollapseFullPath(&local_60,&local_98,in_base);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  ListFileScope::ListFileScope(&local_70,this,&local_60);
  local_98._M_dataplus._M_p = (pointer)0x0;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  cmParseFileScope::cmParseFileScope(&local_40,this);
  bVar2 = cmListFile::ParseFile((cmListFile *)&local_98,local_60._M_dataplus._M_p,false,this);
  pppcVar1 = &((local_40.Makefile)->ContextStack).
              super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  *pppcVar1 = *pppcVar1 + -1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.Context.Name._M_dataplus._M_p != &local_40.Context.Name.field_2) {
    operator_delete(local_40.Context.Name._M_dataplus._M_p,
                    local_40.Context.Name.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    ReadListFile(this,(cmListFile *)&local_98,&local_60);
    if (cmSystemTools::s_FatalErrorOccured == false) {
      bVar3 = cmSystemTools::GetInterruptFlag();
      if (!bVar3) goto LAB_003950ca;
    }
    local_70.ReportError = false;
  }
LAB_003950ca:
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)&local_98);
  ListFileScope::~ListFileScope(&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmMakefile::ReadListFile(const char* filename)
{
  std::string filenametoread =
    cmSystemTools::CollapseFullPath(filename,
                                    this->GetCurrentSourceDirectory());

  ListFileScope scope(this, filenametoread);

  cmListFile listFile;
  {
  cmParseFileScope pfs(this);
  if (!listFile.ParseFile(filenametoread.c_str(), false, this))
    {
    return false;
    }
  }

  this->ReadListFile(listFile, filenametoread);
  if(cmSystemTools::GetFatalErrorOccured())
    {
    scope.Quiet();
    }
  return true;
}